

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.cpp
# Opt level: O0

void fp::API::moveForward(void)

{
  ostream *poVar1;
  string asStack_80 [32];
  undefined1 *puStack_60;
  ostream *local_50;
  undefined1 local_41;
  string *local_40;
  string local_28 [8];
  string response;
  
  puStack_60 = (undefined1 *)0x10593b;
  poVar1 = std::operator<<((ostream *)&std::cout,"moveForward");
  puStack_60 = (undefined1 *)0x10594a;
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_40 = local_28;
  puStack_60 = (undefined1 *)0x105957;
  std::__cxx11::string::string(local_40);
  puStack_60 = (undefined1 *)0x105967;
  std::operator>>((istream *)&std::cin,local_40);
  puStack_60 = (undefined1 *)0x105979;
  local_41 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_28,"ack");
  if (!(bool)local_41) {
    puStack_60 = (undefined1 *)0x1059d6;
    std::__cxx11::string::~string(local_28);
    return;
  }
  puStack_60 = (undefined1 *)0x105997;
  local_50 = std::operator<<((ostream *)&std::cerr,local_28);
  puStack_60 = (undefined1 *)0x1059ad;
  std::ostream::operator<<(local_50,std::endl<char,std::char_traits<char>>);
  puStack_60 = (undefined1 *)0x1059b4;
  __cxa_rethrow();
  puStack_60 = &stack0xfffffffffffffff8;
  poVar1 = std::operator<<((ostream *)&std::cout,"turnRight");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string(asStack_80);
  std::operator>>((istream *)&std::cin,asStack_80);
  std::__cxx11::string::~string(asStack_80);
  return;
}

Assistant:

void fp::API::moveForward() {
    std::cout << "moveForward" << std::endl;
    std::string response;
    std::cin >> response;
    if (response != "ack") {
        std::cerr << response << std::endl;
        throw;
    }
}